

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiWindow_*> *windows;
  ImVector<ImGuiPopupData> *this;
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiIO *pIVar5;
  ImDrawList **ppIVar6;
  ImGuiPopupData *pIVar7;
  ImGuiTabBar *tab_bar;
  ImGuiTabItem *tab;
  ImGuiWindow **ppIVar8;
  char *pcVar9;
  char *label;
  char *pcVar10;
  undefined8 uVar11;
  int i;
  int iVar12;
  uint i_00;
  int i_1;
  char *pcVar13;
  int n;
  ImDrawList *this_00;
  ImVec2 local_140;
  char buf [32];
  
  bVar4 = Begin("ImGui Metrics",p_open,0);
  if (!bVar4) {
    End();
    return;
  }
  pIVar5 = GetIO();
  iVar12 = 0;
  Text("Dear ImGui %s","1.70");
  Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / pIVar5->Framerate),0),
       (double)pIVar5->Framerate);
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)pIVar5->MetricsRenderVertices,
       (ulong)(uint)pIVar5->MetricsRenderIndices,(long)pIVar5->MetricsRenderIndices / 3 & 0xffffffff
      );
  Text("%d active windows (%d visible)",(ulong)(uint)pIVar5->MetricsActiveWindows,
       (ulong)(uint)pIVar5->MetricsRenderWindows);
  Text("%d active allocations",(ulong)(uint)pIVar5->MetricsActiveAllocations);
  Separator();
  pIVar3 = GImGui;
  windows = &GImGui->Windows;
  ShowMetricsWindow::Funcs::NodeWindows(windows,"Windows");
  bVar4 = TreeNode("DrawList","Active DrawLists (%d)",
                   (ulong)(uint)(pIVar3->DrawDataBuilder).Layers[0].Size);
  if (bVar4) {
    for (; iVar12 < (pIVar3->DrawDataBuilder).Layers[0].Size; iVar12 = iVar12 + 1) {
      ppIVar6 = ImVector<ImDrawList_*>::operator[]((pIVar3->DrawDataBuilder).Layers,iVar12);
      ShowMetricsWindow::Funcs::NodeDrawList((ImGuiWindow *)0x0,*ppIVar6,label);
    }
    TreePop();
  }
  bVar4 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar3->OpenPopupStack).Size);
  if (bVar4) {
    this = &pIVar3->OpenPopupStack;
    for (iVar12 = 0; iVar12 < this->Size; iVar12 = iVar12 + 1) {
      pIVar7 = ImVector<ImGuiPopupData>::operator[](this,iVar12);
      pIVar2 = pIVar7->Window;
      pIVar7 = ImVector<ImGuiPopupData>::operator[](this,iVar12);
      pcVar9 = "";
      pcVar10 = "NULL";
      pcVar13 = "";
      if (pIVar2 != (ImGuiWindow *)0x0) {
        pcVar10 = pIVar2->Name;
        pcVar9 = " ChildWindow";
        if (((uint)pIVar2->Flags >> 0x18 & 1) == 0) {
          pcVar9 = "";
        }
        pcVar13 = " ChildMenu";
        if (((uint)pIVar2->Flags >> 0x1c & 1) == 0) {
          pcVar13 = "";
        }
      }
      BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar7->PopupId,pcVar10,pcVar9,pcVar13);
    }
    TreePop();
  }
  bVar4 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar3->TabBars).Data.Size);
  if (bVar4) {
    for (iVar12 = 0; iVar12 < (pIVar3->TabBars).Data.Size; iVar12 = iVar12 + 1) {
      tab_bar = ImVector<ImGuiTabBar>::operator[](&(pIVar3->TabBars).Data,iVar12);
      pcVar10 = "";
      if (tab_bar->PrevFrameVisible < GImGui->FrameCount + -2) {
        pcVar10 = " *Inactive*";
      }
      ImFormatString(buf,0x100,"TabBar (%d tabs)%s",(ulong)(uint)(tab_bar->Tabs).Size,pcVar10);
      bVar4 = TreeNode(tab_bar,"%s",buf);
      if (bVar4) {
        for (i_00 = 0; (int)i_00 < (tab_bar->Tabs).Size; i_00 = i_00 + 1) {
          tab = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,i_00);
          PushID(tab);
          bVar4 = SmallButton("<");
          if (bVar4) {
            TabBarQueueChangeTabOrder(tab_bar,tab,-1);
          }
          SameLine(0.0,2.0);
          bVar4 = SmallButton(">");
          if (bVar4) {
            TabBarQueueChangeTabOrder(tab_bar,tab,1);
          }
          SameLine(0.0,-1.0);
          uVar11 = 0x2a;
          if (tab->ID != tab_bar->SelectedTabId) {
            uVar11 = 0x20;
          }
          Text("%02d%c Tab 0x%08X",(ulong)i_00,uVar11);
          PopID();
        }
        TreePop();
      }
    }
    TreePop();
  }
  bVar4 = TreeNode("Internal state");
  if (bVar4) {
    pcVar9 = "NULL";
    pcVar10 = "NULL";
    if (pIVar3->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar10 = pIVar3->HoveredWindow->Name;
    }
    Text("HoveredWindow: \'%s\'",pcVar10);
    pcVar10 = "NULL";
    if (pIVar3->HoveredRootWindow != (ImGuiWindow *)0x0) {
      pcVar10 = pIVar3->HoveredRootWindow->Name;
    }
    Text("HoveredRootWindow: \'%s\'",pcVar10);
    Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
         SUB84((double)pIVar3->HoveredIdTimer,0),(ulong)pIVar3->HoveredId,
         (ulong)pIVar3->HoveredIdPreviousFrame,(ulong)pIVar3->HoveredIdAllowOverlap);
    Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
         SUB84((double)pIVar3->ActiveIdTimer,0),(ulong)pIVar3->ActiveId,
         (ulong)pIVar3->ActiveIdPreviousFrame,(ulong)pIVar3->ActiveIdAllowOverlap,
         *(undefined8 *)(&DAT_001886f0 + (ulong)pIVar3->ActiveIdSource * 8));
    pcVar10 = "NULL";
    if (pIVar3->ActiveIdWindow != (ImGuiWindow *)0x0) {
      pcVar10 = pIVar3->ActiveIdWindow->Name;
    }
    Text("ActiveIdWindow: \'%s\'",pcVar10);
    pcVar10 = "NULL";
    if (pIVar3->MovingWindow != (ImGuiWindow *)0x0) {
      pcVar10 = pIVar3->MovingWindow->Name;
    }
    Text("MovingWindow: \'%s\'",pcVar10);
    pcVar10 = "NULL";
    if (pIVar3->NavWindow != (ImGuiWindow *)0x0) {
      pcVar10 = pIVar3->NavWindow->Name;
    }
    Text("NavWindow: \'%s\'",pcVar10);
    Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar3->NavId,(ulong)pIVar3->NavLayer);
    Text("NavInputSource: %s",*(undefined8 *)(&DAT_001886f0 + (ulong)pIVar3->NavInputSource * 8));
    Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar3->IO).NavActive,
         (ulong)(pIVar3->IO).NavVisible);
    Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar3->NavActivateId,
         (ulong)pIVar3->NavInputId);
    Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar3->NavDisableHighlight,
         (ulong)pIVar3->NavDisableMouseHover);
    if (pIVar3->NavWindowingTarget != (ImGuiWindow *)0x0) {
      pcVar9 = pIVar3->NavWindowingTarget->Name;
    }
    Text("NavWindowingTarget: \'%s\'",pcVar9);
    Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)pIVar3->DragDropActive,
         (ulong)(pIVar3->DragDropPayload).SourceId,(pIVar3->DragDropPayload).DataType,
         (ulong)(uint)(pIVar3->DragDropPayload).DataSize);
    TreePop();
  }
  bVar4 = TreeNode("Tools");
  if (bVar4) {
    Checkbox("Show windows begin order",&ShowMetricsWindow::show_windows_begin_order);
    Checkbox("Show windows rectangles",&ShowMetricsWindow::show_windows_rects);
    SameLine(0.0,-1.0);
    fVar1 = GImGui->FontSize;
    pIVar2 = GImGui->CurrentWindow;
    pIVar2->WriteAccessed = true;
    (pIVar2->DC).NextItemWidth = fVar1 * 12.0;
    bVar4 = Combo("##rects_type",&ShowMetricsWindow::show_windows_rect_type,"OuterRect",-1);
    ShowMetricsWindow::show_windows_rects = (bool)(ShowMetricsWindow::show_windows_rects | bVar4);
    Checkbox("Show clipping rectangle when hovering ImDrawCmd node",
             &ShowMetricsWindow::show_drawcmd_clip_rects);
    TreePop();
  }
  if ((ShowMetricsWindow::show_windows_rects != false) ||
     (ShowMetricsWindow::show_windows_begin_order == true)) {
    for (iVar12 = 0; iVar12 < windows->Size; iVar12 = iVar12 + 1) {
      ppIVar8 = ImVector<ImGuiWindow_*>::operator[](windows,iVar12);
      pIVar2 = *ppIVar8;
      if (pIVar2->WasActive != true) goto LAB_0011a02c;
      this_00 = &GImGui->ForegroundDrawList;
      if (ShowMetricsWindow::show_windows_rects != true) goto LAB_00119fac;
      buf[8] = -1;
      buf[9] = -1;
      buf[10] = '\x7f';
      buf[0xb] = -1;
      buf[0xc] = -1;
      buf[0xd] = -1;
      buf[0xe] = '\x7f';
      buf[0xf] = -1;
      buf[0] = -1;
      buf[1] = -1;
      buf[2] = '\x7f';
      buf[3] = '\x7f';
      buf[4] = -1;
      buf[5] = -1;
      buf[6] = '\x7f';
      buf[7] = '\x7f';
      switch(ShowMetricsWindow::show_windows_rect_type) {
      case 0:
        buf._0_16_ = (undefined1  [16])ImGuiWindow::Rect(pIVar2);
        goto switchD_00119f49_default;
      case 1:
        buf._0_4_ = (pIVar2->OuterRectClipped).Min.x;
        buf._4_4_ = (pIVar2->OuterRectClipped).Min.y;
        buf._8_4_ = (pIVar2->OuterRectClipped).Max.x;
        buf._12_4_ = (pIVar2->OuterRectClipped).Max.y;
        break;
      case 2:
        buf._0_4_ = (pIVar2->InnerMainRect).Min.x;
        buf._4_4_ = (pIVar2->InnerMainRect).Min.y;
        buf._8_4_ = (pIVar2->InnerMainRect).Max.x;
        buf._12_4_ = (pIVar2->InnerMainRect).Max.y;
        break;
      case 3:
        buf._0_4_ = (pIVar2->InnerClipRect).Min.x;
        buf._4_4_ = (pIVar2->InnerClipRect).Min.y;
        buf._8_4_ = (pIVar2->InnerClipRect).Max.x;
        buf._12_4_ = (pIVar2->InnerClipRect).Max.y;
        break;
      case 4:
        buf._0_4_ = (pIVar2->ContentsRegionRect).Min.x;
        buf._4_4_ = (pIVar2->ContentsRegionRect).Min.y;
        buf._8_4_ = (pIVar2->ContentsRegionRect).Max.x;
        buf._12_4_ = (pIVar2->ContentsRegionRect).Max.y;
        break;
      default:
        goto switchD_00119f49_default;
      }
switchD_00119f49_default:
      ImDrawList::AddRect(this_00,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
LAB_00119fac:
      if ((ShowMetricsWindow::show_windows_begin_order == true) &&
         ((pIVar2->Flags & 0x1000000) == 0)) {
        ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar2->BeginOrderWithinContext);
        local_140.y = GImGui->FontSize + (pIVar2->Pos).y;
        local_140.x = GImGui->FontSize + (pIVar2->Pos).x;
        ImDrawList::AddRectFilled(this_00,&pIVar2->Pos,&local_140,0xff6464c8,0.0,0xf);
        ImDrawList::AddText(this_00,&pIVar2->Pos,0xffffffff,buf,(char *)0x0);
      }
LAB_0011a02c:
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    enum { RT_OuterRect, RT_OuterRectClipped, RT_InnerMainRect, RT_InnerClipRect, RT_ContentsRegionRect, RT_ContentsFullRect };
    static bool show_windows_begin_order = false;
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = RT_ContentsRegionRect;
    static bool show_drawcmd_clip_rects = true;

    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    struct Funcs
    {
        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "idx" : "   ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
                Funcs::NodeWindow(windows[i], "Window");
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetWindowScrollMaxX(window), window->Scroll.y, GetWindowScrollMaxY(window));
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
            ImGui::TreePop();
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s", tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }
    };

    // Access private state, we are going to display the draw lists from last frame
    ImGuiContext& g = *GImGui;
    Funcs::NodeWindows(g.Windows, "Windows");
    if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.Data.Size))
    {
        for (int n = 0; n < g.TabBars.Data.Size; n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Tools"))
    {
        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##rects_type", &show_windows_rect_type, "OuterRect\0" "OuterRectClipped\0" "InnerMainRect\0" "InnerClipRect\0" "ContentsRegionRect\0");
        ImGui::Checkbox("Show clipping rectangle when hovering ImDrawCmd node", &show_drawcmd_clip_rects);
        ImGui::TreePop();
    }

    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r;
                if (show_windows_rect_type == RT_OuterRect)                 { r = window->Rect(); }
                else if (show_windows_rect_type == RT_OuterRectClipped)     { r = window->OuterRectClipped; }
                else if (show_windows_rect_type == RT_InnerMainRect)        { r = window->InnerMainRect; }
                else if (show_windows_rect_type == RT_InnerClipRect)        { r = window->InnerClipRect; }
                else if (show_windows_rect_type == RT_ContentsRegionRect)   { r = window->ContentsRegionRect; }
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }
    ImGui::End();
}